

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_atomic.c
# Opt level: O3

void test_atomic(void)

{
  undefined8 uVar1;
  char cVar2;
  int iVar3;
  undefined1 local_e0 [8];
  thread_pool_t tp;
  
  tp_init(local_e0,10);
  tp_start(local_e0);
  iVar3 = 0x14;
  do {
    uVar1 = tp_task_create(f,cleanup,0,0);
    tp_post_task(local_e0,uVar1);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  cVar2 = tp_join_tasks(local_e0);
  if (cVar2 == '\0') {
    __assert_fail("tp_join_tasks(&tp)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/WqyJh[P]thread_pool/test/test_atomic.c"
                  ,0x34,"void test_atomic()");
  }
  if (tp.has_task.__data.__g_signals[0] != 0) {
    __assert_fail("tp.active_tasks == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/WqyJh[P]thread_pool/test/test_atomic.c"
                  ,0x36,"void test_atomic()");
  }
  iVar3 = queue_len(&tp.threads);
  if (iVar3 == 0) {
    test_atomic_cold_1();
    return;
  }
  __assert_fail("queue_isempty(&tp.task_queue)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/WqyJh[P]thread_pool/test/test_atomic.c"
                ,0x37,"void test_atomic()");
}

Assistant:

void test_atomic()
{
    int i;
    thread_pool_t tp;
    tp_task_t *tasks[TASK_NUM];

    tp_init(&tp, THREAD_NUM);
    tp_start(&tp);

    for (i = 0; i < TASK_NUM; ++i) {
        tasks[i] = tp_task_create(f, cleanup, NULL, 0);
        tp_post_task(&tp, tasks[i]);
    }

//    assert(TASK_NUM == tp_post_tasks(&tp, tasks, TASK_NUM));
    assert(tp_join_tasks(&tp));

    assert(tp.active_tasks == 0);
    assert(queue_isempty(&tp.task_queue));

    fprintf(stderr, "The atomic counter is %u\n", acnt);
    fprintf(stderr, "The non-atomic counter is %u\n", cnt);

    tp_destroy(&tp);
}